

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

StructBuilder * __thiscall
capnp::_::OrphanBuilder::asStruct
          (StructBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  SegmentId id;
  BuilderArena *pBVar3;
  word *pwVar4;
  ushort uVar5;
  SegmentBuilder *this_00;
  SegmentBuilder *pSVar6;
  SegmentBuilder *pSVar7;
  undefined8 *puVar8;
  int iVar9;
  OrphanBuilder *pOVar10;
  word *result_1;
  OrphanBuilder *pOVar11;
  WirePointer *pWVar12;
  uint uVar13;
  WirePointer *src;
  StructSize SVar14;
  uint uVar15;
  ushort uVar16;
  ushort uVar17;
  uint uVar18;
  ulong uVar19;
  WirePointer *dst;
  CapTableBuilder *capTable;
  bool bVar20;
  AllocateResult AVar21;
  AllocateResult AVar22;
  AllocateResult AVar23;
  Fault f;
  anon_class_1_0_00000001 local_6a;
  anon_class_1_0_00000001 local_69;
  OrphanBuilder *local_68;
  OrphanBuilder *local_60;
  CapTableBuilder *local_58;
  StructBuilder *local_50;
  ulong local_48;
  ulong local_40;
  Fault local_38;
  
  pSVar7 = this->segment;
  capTable = this->capTable;
  pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
  uVar15 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  uVar16 = size.data;
  uVar17 = size.pointers;
  if (id.value != 0 || uVar15 != 0) {
    local_50 = __return_storage_ptr__;
    local_58 = capTable;
    if ((uVar15 & 3) == 2) {
      this_00 = BuilderArena::getSegment(pBVar3,id);
      uVar15 = (uint)(this->tag).content;
      pwVar4 = (this_00->super_SegmentReader).ptr.ptr;
      uVar19 = (ulong)(uVar15 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar4->content + uVar19);
      pOVar11 = (OrphanBuilder *)((long)&pwVar4[1].content + uVar19);
      if ((uVar15 & 4) == 0) {
        pOVar10 = (OrphanBuilder *)(&pOVar11->tag + ((int)(pOVar1->tag).content >> 2));
        pOVar11 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pOVar10 = (OrphanBuilder *)
                  ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                  (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pOVar10 = (OrphanBuilder *)this->location;
      this_00 = pSVar7;
      pOVar11 = this;
    }
    if (this_00->readOnly == true) {
      local_60 = pOVar10;
      SegmentBuilder::throwNotWritable(this_00);
      pOVar10 = local_60;
    }
    if (((pOVar11->tag).content & 3) == 0) {
      uVar2 = *(ushort *)((long)&(pOVar11->tag).content + 4);
      local_48 = (ulong)uVar2;
      uVar15 = (uint)uVar2;
      SVar14.pointers = 0;
      SVar14.data = uVar2;
      uVar5 = *(ushort *)((long)&(pOVar11->tag).content + 6);
      src = (WirePointer *)(&pOVar10->tag + local_48);
      pWVar12 = src;
      pSVar6 = this_00;
      if (uVar5 < uVar17 || uVar2 < uVar16) {
        if (uVar2 <= uVar16) {
          SVar14 = size;
        }
        uVar13 = (uint)size >> 0x10;
        if (uVar17 < uVar5) {
          uVar13 = (uint)uVar5;
        }
        local_68 = (OrphanBuilder *)CONCAT44(local_68._4_4_,SVar14);
        uVar15 = (uint)SVar14 & 0xffff;
        local_60 = pOVar10;
        if ((((this->tag).content & 3) == 2) &&
           (pSVar6 = BuilderArena::getSegment
                               ((BuilderArena *)(pSVar7->super_SegmentReader).arena,
                                (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
           pSVar6->readOnly == false)) {
          uVar18 = (uint)(this->tag).content;
          puVar8 = (undefined8 *)
                   ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                   (ulong)(uVar18 & 0xfffffff8));
          if ((uVar18 & 4) == 0) {
            *puVar8 = 0;
          }
          else {
            *puVar8 = 0;
            puVar8[1] = 0;
          }
        }
        uVar18 = uVar13 + uVar15;
        (this->tag).content = 0;
        pOVar10 = this;
        if (pBVar3 == (BuilderArena *)0x0) {
          if (uVar18 == 0) {
            *(undefined4 *)&(this->tag).content = 0xfffffffc;
            AVar21.words = &this->tag;
            AVar21.segment = pSVar7;
          }
          else {
            pwVar4 = pSVar7->pos;
            AVar21.words = pwVar4;
            AVar21.segment = pSVar7;
            if (((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                       ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar4)) >> 3 <
                 (long)(ulong)uVar18) || (pSVar7->pos = pwVar4 + uVar18, pwVar4 == (word *)0x0)) {
              pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
              uVar18 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                                 (uVar18 + 1,&local_6a);
              AVar21 = BuilderArena::allocate(pBVar3,uVar18);
              pOVar10 = (OrphanBuilder *)AVar21.words;
              pSVar7 = AVar21.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar21.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar10->tag).content = 0;
              AVar21.words = (word *)&pOVar10->segment;
              AVar21.segment = pSVar7;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar4 - (long)this) >> 1) & 0xfffffffc) - 4;
            }
          }
        }
        else {
          AVar21 = BuilderArena::allocate(pBVar3,uVar18);
          *(undefined4 *)&(this->tag).content = 0xfffffffc;
        }
        pOVar11 = (OrphanBuilder *)AVar21.words;
        pSVar6 = AVar21.segment;
        uVar19 = (ulong)uVar5;
        uVar18 = (uint)local_68;
        *(short *)((long)&(pOVar10->tag).content + 4) = (short)local_68;
        uVar5 = (ushort)uVar13;
        *(ushort *)((long)&(pOVar10->tag).content + 6) = uVar5;
        if ((int)local_48 != 0) {
          memcpy(pOVar11,local_60,(ulong)(uint)((int)local_48 << 3));
        }
        pWVar12 = (WirePointer *)(&pOVar11->tag + (uVar18 & 0xffff));
        dst = pWVar12;
        local_68 = pOVar11;
        local_40 = uVar19;
        while (bVar20 = uVar19 != 0, uVar19 = uVar19 - 1, bVar20) {
          WireHelpers::transferPointer(pSVar6,dst,this_00,src);
          dst = dst + 1;
          src = src + 1;
        }
        iVar9 = (int)local_40 + (int)local_48;
        pOVar10 = local_68;
        if (iVar9 != 0) {
          memset(local_60,0,(ulong)(uint)(iVar9 * 8));
          pOVar10 = local_68;
        }
      }
      goto LAB_00197d63;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[71]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x465,FAILED,"oldRef->kind() == WirePointer::STRUCT",
               "\"Message contains non-struct pointer where struct pointer was expected.\"",
               (char (*) [71])
               "Message contains non-struct pointer where struct pointer was expected.");
    kj::_::Debug::Fault::~Fault(&local_38);
    __return_storage_ptr__ = local_50;
    capTable = local_58;
  }
  uVar15 = (uint)size & 0xffff;
  uVar13 = ((uint)size >> 0x10) + uVar15;
  if (pBVar3 == (BuilderArena *)0x0) {
    if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
      WireHelpers::zeroObject(pSVar7,capTable,(WirePointer *)this);
    }
    if (uVar13 == 0) {
      *(undefined4 *)&(this->tag).content = 0xfffffffc;
      AVar23.words = &this->tag;
      AVar23.segment = pSVar7;
      pOVar10 = this;
    }
    else {
      pwVar4 = pSVar7->pos;
      AVar22.words = pwVar4;
      AVar22.segment = pSVar7;
      if (((long)(ulong)uVar13 <=
           (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                 ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar4)) >> 3) &&
         (pSVar7->pos = pwVar4 + uVar13, pwVar4 != (word *)0x0)) {
        *(uint *)&(this->tag).content =
             ((uint)((ulong)((long)pwVar4 - (long)this) >> 1) & 0xfffffffc) - 4;
        goto LAB_00197d4d;
      }
      pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
      uVar13 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                         (uVar13 + 1,&local_69);
      AVar23 = BuilderArena::allocate(pBVar3,uVar13);
      *(uint *)&(this->tag).content =
           (int)AVar23.words - *(int *)&((AVar23.segment)->super_SegmentReader).ptr.ptr &
           0xfffffff8U | 2;
      *(uint *)((long)&(this->tag).content + 4) = ((AVar23.segment)->super_SegmentReader).id.value;
      *(undefined4 *)&(AVar23.words)->content = 0;
      pOVar10 = (OrphanBuilder *)(AVar23.words + 1);
    }
  }
  else {
    AVar22 = BuilderArena::allocate(pBVar3,uVar13);
    *(undefined4 *)&(this->tag).content = 0xfffffffc;
LAB_00197d4d:
    AVar23.words = &this->tag;
    AVar23.segment = AVar22.segment;
    pOVar10 = (OrphanBuilder *)AVar22.words;
  }
  *(ushort *)((long)&(AVar23.words)->content + 4) = uVar16;
  *(ushort *)((long)&(AVar23.words)->content + 6) = uVar17;
  pWVar12 = (WirePointer *)(&pOVar10->tag + uVar15);
  pSVar6 = AVar23.segment;
  local_50 = __return_storage_ptr__;
  local_58 = capTable;
  uVar5 = uVar17;
LAB_00197d63:
  local_50->segment = pSVar6;
  local_50->capTable = local_58;
  local_50->data = pOVar10;
  local_50->pointers = pWVar12;
  local_50->dataSize = uVar15 << 6;
  local_50->pointerCount = uVar5;
  this->location = &pOVar10->tag;
  return local_50;
}

Assistant:

StructBuilder OrphanBuilder::asStruct(StructSize size) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  StructBuilder result = WireHelpers::getWritableStructPointer(
      tagAsPtr(), location, segment, capTable, size, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = reinterpret_cast<word*>(result.data);

  return result;
}